

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

void __thiscall serial::Serial::SerialImpl::setDTR(SerialImpl *this,bool level)

{
  int iVar1;
  PortNotOpenedException *this_00;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  SerialException *pSVar5;
  stringstream local_360 [8];
  stringstream ss_1;
  ostream local_350 [383];
  undefined1 local_1d1;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  undefined4 local_28 [2];
  int command;
  undefined1 local_11;
  SerialImpl *pSStack_10;
  bool level_local;
  SerialImpl *this_local;
  
  local_11 = level;
  pSStack_10 = this;
  if ((this->is_open_ & 1U) == 0) {
    this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x48);
    PortNotOpenedException::PortNotOpenedException(this_00,"Serial::setDTR");
    __cxa_throw(this_00,&PortNotOpenedException::typeinfo,
                PortNotOpenedException::~PortNotOpenedException);
  }
  local_28[0] = 2;
  if (level) {
    iVar1 = ioctl(this->fd_,0x5416,local_28);
    if (iVar1 == -1) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      poVar2 = std::operator<<(local_1a0,"setDTR failed on a call to ioctl(TIOCMBIS): ");
      piVar3 = __errno_location();
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
      poVar2 = std::operator<<(poVar2," ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      local_1d1 = 1;
      pSVar5 = (SerialException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      SerialException::SerialException(pSVar5,pcVar4);
      local_1d1 = 0;
      __cxa_throw(pSVar5,&SerialException::typeinfo,SerialException::~SerialException);
    }
  }
  else {
    iVar1 = ioctl(this->fd_,0x5417,local_28);
    if (iVar1 == -1) {
      std::__cxx11::stringstream::stringstream(local_360);
      poVar2 = std::operator<<(local_350,"setDTR failed on a call to ioctl(TIOCMBIC): ");
      piVar3 = __errno_location();
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
      poVar2 = std::operator<<(poVar2," ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      pSVar5 = (SerialException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      SerialException::SerialException(pSVar5,pcVar4);
      __cxa_throw(pSVar5,&SerialException::typeinfo,SerialException::~SerialException);
    }
  }
  return;
}

Assistant:

void
Serial::SerialImpl::setDTR (bool level)
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::setDTR");
  }

  int command = TIOCM_DTR;

  if (level) {
    if (-1 == ioctl (fd_, TIOCMBIS, &command))
    {
      stringstream ss;
      ss << "setDTR failed on a call to ioctl(TIOCMBIS): " << errno << " " << strerror(errno);
      throw(SerialException(ss.str().c_str()));
    }
  } else {
    if (-1 == ioctl (fd_, TIOCMBIC, &command))
    {
      stringstream ss;
      ss << "setDTR failed on a call to ioctl(TIOCMBIC): " << errno << " " << strerror(errno);
      throw(SerialException(ss.str().c_str()));
    }
  }
}